

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O1

void __thiscall
iu_UnitStringTest_x_iutest_x_OwnStricmp_Test::Body
          (iu_UnitStringTest_x_iutest_x_OwnStricmp_Test *this)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  iu_global_format_stringstream *this_00;
  int *in_R9;
  int iVar4;
  long lVar5;
  AssertionResult iutest_ar;
  int *in_stack_fffffffffffffde8;
  AssertionResult local_210;
  AssertionHelper local_1e8;
  undefined1 local_1b8 [392];
  
  local_1b8._0_4_ = 0;
  lVar5 = 0;
  do {
    cVar1 = "aaaa"[lVar5 + 1];
    if ("AAAA"[lVar5 + 1] == '\0') {
      uVar2 = toupper(0);
      uVar3 = toupper((int)cVar1);
      local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
           (uVar2 & 0xff) - (uVar3 & 0xff);
      break;
    }
    uVar2 = toupper((int)"AAAA"[lVar5 + 1]);
    uVar3 = toupper((int)cVar1);
    lVar5 = lVar5 + 1;
    local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
         (uVar2 & 0xff) - (uVar3 & 0xff);
  } while ((uint)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p == 0);
  iutest::internal::CmpHelperEQ<int,int>
            (&local_210,(internal *)0x171a14,
             "::iutest::detail::wrapper::iu_stricmp(\"AAA\", \"aaa\")",local_1b8,(int *)&local_1e8,
             in_R9);
  if (local_210.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x24;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (uint)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (uint)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p),
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1b8._0_4_ = 0;
  lVar5 = 0;
  do {
    cVar1 = "aaaa"[lVar5 + 1];
    if ("AAAa"[lVar5] == '\0') {
      uVar2 = toupper(0);
      uVar3 = toupper((int)cVar1);
      iVar4 = (uVar2 & 0xff) - (uVar3 & 0xff);
      break;
    }
    uVar2 = toupper((int)"AAAa"[lVar5]);
    uVar3 = toupper((int)cVar1);
    lVar5 = lVar5 + 1;
    iVar4 = (uVar2 & 0xff) - (uVar3 & 0xff);
  } while (iVar4 == 0);
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = iVar4;
  if ((int)(uint)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p < 1) {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_210,(internal *)0x171a14,
               "::iutest::detail::wrapper::iu_stricmp(\"AAAa\", \"aaa\")","<",local_1b8,
               (int *)&local_1e8,in_stack_fffffffffffffde8);
  }
  else {
    local_210.m_message._M_dataplus._M_p = (pointer)&local_210.m_message.field_2;
    local_210.m_message._M_string_length = 0;
    local_210.m_message.field_2._M_local_buf[0] = '\0';
    local_210.m_result = true;
  }
  if (local_210.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x25;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (uint)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (uint)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p),
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1b8._0_4_ = 0;
  lVar5 = 0;
  do {
    cVar1 = "aaaa"[lVar5];
    if ("AAAB"[lVar5] == '\0') {
      uVar2 = toupper(0);
      uVar3 = toupper((int)cVar1);
      iVar4 = (uVar2 & 0xff) - (uVar3 & 0xff);
      break;
    }
    uVar2 = toupper((int)"AAAB"[lVar5]);
    uVar3 = toupper((int)cVar1);
    lVar5 = lVar5 + 1;
    iVar4 = (uVar2 & 0xff) - (uVar3 & 0xff);
  } while (iVar4 == 0);
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = iVar4;
  if ((int)(uint)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p < 1) {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_210,(internal *)0x171a14,
               "::iutest::detail::wrapper::iu_stricmp(\"AAAB\", \"aaaa\")","<",local_1b8,
               (int *)&local_1e8,in_stack_fffffffffffffde8);
  }
  else {
    local_210.m_message._M_dataplus._M_p = (pointer)&local_210.m_message.field_2;
    local_210.m_message._M_string_length = 0;
    local_210.m_message.field_2._M_local_buf[0] = '\0';
    local_210.m_result = true;
  }
  if (local_210.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x26;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (uint)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (uint)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p),
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1b8._0_4_ = 0;
  lVar5 = 0;
  do {
    cVar1 = "aaab"[lVar5];
    if ("AAAA"[lVar5] == '\0') {
      uVar2 = toupper(0);
      uVar3 = toupper((int)cVar1);
      iVar4 = (uVar2 & 0xff) - (uVar3 & 0xff);
      break;
    }
    uVar2 = toupper((int)"AAAA"[lVar5]);
    uVar3 = toupper((int)cVar1);
    lVar5 = lVar5 + 1;
    iVar4 = (uVar2 & 0xff) - (uVar3 & 0xff);
  } while (iVar4 == 0);
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = iVar4;
  if ((int)(uint)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p < 0) {
    local_210.m_message._M_dataplus._M_p = (pointer)&local_210.m_message.field_2;
    local_210.m_message._M_string_length = 0;
    local_210.m_message.field_2._M_local_buf[0] = '\0';
    local_210.m_result = true;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_210,(internal *)0x171a14,
               "::iutest::detail::wrapper::iu_stricmp(\"AAAA\", \"aaab\")",">",local_1b8,
               (int *)&local_1e8,in_stack_fffffffffffffde8);
  }
  if (local_210.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x27;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (uint)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (uint)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p),
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1b8._0_4_ = 0;
  lVar5 = 0;
  do {
    cVar1 = (&DAT_0017025a)[lVar5];
    if ("AAAA"[lVar5 + 1] == '\0') {
      uVar2 = toupper(0);
      uVar3 = toupper((int)cVar1);
      uVar2 = (uVar2 & 0xff) - (uVar3 & 0xff);
      break;
    }
    uVar2 = toupper((int)"AAAA"[lVar5 + 1]);
    uVar3 = toupper((int)cVar1);
    lVar5 = lVar5 + 1;
    uVar2 = (uVar2 & 0xff) - (uVar3 & 0xff);
  } while (uVar2 == 0);
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = uVar2;
  this_00 = (iu_global_format_stringstream *)
            (ulong)(uint)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  if ((int)(uint)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p < 0) {
    local_210.m_message._M_dataplus._M_p = (pointer)&local_210.m_message.field_2;
    local_210.m_message._M_string_length = 0;
    local_210.m_message.field_2._M_local_buf[0] = '\0';
    local_210.m_result = true;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_210,(internal *)0x171a14,
               "::iutest::detail::wrapper::iu_stricmp(\"AAA\", negative_sample)",">",local_1b8,
               (int *)&local_1e8,in_stack_fffffffffffffde8);
  }
  if (local_210.m_result == false) {
    this_00 = (iu_global_format_stringstream *)local_1b8;
    memset(this_00,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream(this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x28;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (uint)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (uint)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p),
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  local_1b8._0_4_ = 0;
  lVar5 = 0;
  do {
    cVar1 = "aaaA"[lVar5];
    if ("AAAA"[lVar5 + 1] == '\0') {
      uVar2 = toupper(0);
      uVar3 = toupper((int)cVar1);
      iVar4 = (uVar2 & 0xff) - (uVar3 & 0xff);
      break;
    }
    uVar2 = toupper((int)"AAAA"[lVar5 + 1]);
    uVar3 = toupper((int)cVar1);
    lVar5 = lVar5 + 1;
    uVar2 = (uVar2 & 0xff) - (uVar3 & 0xff);
    this_00 = (iu_global_format_stringstream *)((ulong)this_00 & 0xffffffff);
    if (uVar2 != 0) {
      this_00 = (iu_global_format_stringstream *)(ulong)uVar2;
    }
    iVar4 = (int)this_00;
  } while (uVar2 == 0);
  local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = iVar4;
  if (iVar4 < 0) {
    local_210.m_message._M_dataplus._M_p = (pointer)&local_210.m_message.field_2;
    local_210.m_message._M_string_length = 0;
    local_210.m_message.field_2._M_local_buf[0] = '\0';
    local_210.m_result = true;
  }
  else {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_210,(internal *)0x171a14,
               "::iutest::detail::wrapper::iu_stricmp(\"AAA\", \"aaaA\")",">",local_1b8,
               (int *)&local_1e8,in_stack_fffffffffffffde8);
  }
  if (local_210.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x29;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (uint)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (uint)local_1e8.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p),
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    CONCAT71(local_210.m_message.field_2._M_allocated_capacity._1_7_,
                             local_210.m_message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, OwnStricmp)
{
    const char negative = static_cast<char>(-1);
    const char negative_sample[] = { 'a', 'a', 'a', negative, '\0' };
    IUTEST_EXPECT_EQ(0, ::iutest::detail::wrapper::iu_stricmp("AAA", "aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_stricmp("AAAa", "aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_stricmp("AAAB", "aaaa"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_stricmp("AAAA", "aaab"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_stricmp("AAA", negative_sample));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_stricmp("AAA", "aaaA"));
}